

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDColor.cpp
# Opt level: O0

void __thiscall EDColor::smoothChannel(EDColor *this,uchar *src,uchar *smooth,double sigma)

{
  Size_<int> local_1a0;
  _OutputArray local_198;
  _InputArray local_180;
  Size_<int> local_168;
  _OutputArray local_160;
  _InputArray local_148;
  Size_<int> local_130;
  _OutputArray local_128;
  _InputArray local_110;
  Mat local_e8 [8];
  Mat smoothImage;
  Mat local_88 [8];
  Mat srcImage;
  double sigma_local;
  uchar *smooth_local;
  uchar *src_local;
  EDColor *this_local;
  
  cv::Mat::Mat(local_88,this->height,this->width,0,src,0);
  cv::Mat::Mat(local_e8,this->height,this->width,0,smooth,0);
  if ((sigma != 1.0) || (NAN(sigma))) {
    if ((sigma != 1.5) || (NAN(sigma))) {
      cv::_InputArray::_InputArray(&local_180,local_88);
      cv::_OutputArray::_OutputArray(&local_198,local_e8);
      cv::Size_<int>::Size_(&local_1a0);
      cv::GaussianBlur(sigma,0,&local_180,&local_198,&local_1a0,4);
      cv::_OutputArray::~_OutputArray(&local_198);
      cv::_InputArray::~_InputArray(&local_180);
    }
    else {
      cv::_InputArray::_InputArray(&local_148,local_88);
      cv::_OutputArray::_OutputArray(&local_160,local_e8);
      cv::Size_<int>::Size_(&local_168,7,7);
      cv::GaussianBlur(0x3ff8000000000000,0,&local_148,&local_160,&local_168,4);
      cv::_OutputArray::~_OutputArray(&local_160);
      cv::_InputArray::~_InputArray(&local_148);
    }
  }
  else {
    cv::_InputArray::_InputArray(&local_110,local_88);
    cv::_OutputArray::_OutputArray(&local_128,local_e8);
    cv::Size_<int>::Size_(&local_130,5,5);
    cv::GaussianBlur(0x3ff0000000000000,0,&local_110,&local_128,&local_130,4);
    cv::_OutputArray::~_OutputArray(&local_128);
    cv::_InputArray::~_InputArray(&local_110);
  }
  cv::Mat::~Mat(local_e8);
  cv::Mat::~Mat(local_88);
  return;
}

Assistant:

void EDColor::smoothChannel(uchar *src, uchar *smooth, double sigma)
{
	Mat srcImage = Mat(height, width, CV_8UC1, src);
	Mat smoothImage = Mat(height, width, CV_8UC1, smooth);

	if (sigma == 1.0)
		GaussianBlur(srcImage, smoothImage, Size(5, 5), 1);
	else if (sigma == 1.5)
		GaussianBlur(srcImage, smoothImage, Size(7, 7), 1.5);  // seems to be better?
	else
		GaussianBlur(srcImage, smoothImage, Size(), sigma);
}